

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

UHashElement * uhash_nextElement_63(UHashtable *hash,int32_t *pos)

{
  int local_24;
  int32_t i;
  int32_t *pos_local;
  UHashtable *hash_local;
  
  local_24 = *pos;
  do {
    local_24 = local_24 + 1;
    if (hash->length <= local_24) {
      return (UHashElement *)0x0;
    }
  } while (hash->elements[local_24].hashcode < 0);
  *pos = local_24;
  return hash->elements + local_24;
}

Assistant:

U_CAPI const UHashElement* U_EXPORT2
uhash_nextElement(const UHashtable *hash, int32_t *pos) {
    /* Walk through the array until we find an element that is not
     * EMPTY and not DELETED.
     */
    int32_t i;
    U_ASSERT(hash != NULL);
    for (i = *pos + 1; i < hash->length; ++i) {
        if (!IS_EMPTY_OR_DELETED(hash->elements[i].hashcode)) {
            *pos = i;
            return &(hash->elements[i]);
        }
    }

    /* No more elements */
    return NULL;
}